

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O2

int __thiscall
webfront::http::
Server<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
::accept(Server<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
         *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  completion_handler_type local_8;
  
  local_8.this = this;
  ::std::experimental::net::v1::basic_socket_acceptor<std::experimental::net::v1::ip::tcp>::
  async_accept<webfront::http::Server<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>>::accept()::_lambda(std::error_code,std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>)_1_>
            (&this->acceptor,&local_8);
  return (int)local_8.this;
}

Assistant:

void accept() {
        acceptor.async_accept([this](std::error_code ec, typename Net::Socket socket) {
            if (!acceptor.is_open()) return;
            auto newConnection = std::make_shared<Connection<Net, FS>>(std::move(socket), connections, requestHandler);
            newConnection->onUpgrade = upgradeHandler;
            if (!ec) connections.start(newConnection);
            accept();
        });
    }